

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O2

void __thiscall
csv::internals::IBasicCSVParser::IBasicCSVParser
          (IBasicCSVParser *this,CSVFormat *format,ColNamesPtr *col_names)

{
  char *ws_chars;
  char cVar1;
  ParseFlagMap PStack_418;
  
  this->_vptr_IBasicCSVParser = (_func_int **)&PTR__IBasicCSVParser_00114ad8;
  (this->current_row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->current_row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->current_row).data_start = 0;
  (this->current_row).fields_start = 0;
  (this->current_row).row_length = 0;
  (this->data_ptr).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->data_ptr).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_col_names).
              super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>,
             &col_names->super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>);
  this->fields = (CSVFieldList *)0x0;
  this->field_start = -1;
  this->field_length = 0;
  this->_eof = false;
  this->source_size = 0;
  this->quote_escape = false;
  this->field_has_double_quote = false;
  this->data_pos = 0;
  this->unicode_bom_scan = false;
  this->_utf8_bom = false;
  this->_records = (RowCollection *)0x0;
  if (format->no_quote == true) {
    cVar1 = CSVFormat::get_delim(format);
    make_parse_flags(&PStack_418,cVar1);
  }
  else {
    cVar1 = CSVFormat::get_delim(format);
    make_parse_flags(&PStack_418,cVar1,format->quote_char);
  }
  memcpy(&this->_parse_flags,&PStack_418,0x400);
  ws_chars = (format->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  make_ws_flags((WhitespaceMap *)&PStack_418,ws_chars,
                (long)(format->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ws_chars);
  memcpy(&this->_ws_flags,&PStack_418,0x100);
  return;
}

Assistant:

CSV_INLINE IBasicCSVParser::IBasicCSVParser(
            const CSVFormat& format,
            const ColNamesPtr& col_names
        ) : _col_names(col_names) {
            if (format.no_quote) {
                _parse_flags = internals::make_parse_flags(format.get_delim());
            }
            else {
                _parse_flags = internals::make_parse_flags(format.get_delim(), format.quote_char);
            }

            _ws_flags = internals::make_ws_flags(
                format.trim_chars.data(), format.trim_chars.size()
            );
        }